

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-callback-stack.c
# Opt level: O2

void connect_cb(uv_connect_t *req,int status)

{
  uv_stream_t *puVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined8 uStack_10040;
  uv_buf_t send_bufs [4096];
  
  puVar1 = connect_req.handle;
  if (req == &connect_req) {
    if (status == 0) {
      connect_cb_called = connect_cb_called + 1;
      lVar5 = 0;
      do {
        if (lVar5 == 3) {
          uStack_10040 = 0x15c0ca;
          iVar2 = uv_shutdown(&shutdown_req,puVar1,shutdown_cb);
          if (iVar2 == 0) {
            uStack_10040 = 0x15c0e4;
            iVar2 = uv_read_start(puVar1,alloc_cb,read_cb);
            if (iVar2 == 0) {
              return;
            }
            pcVar4 = "r == 0";
            uVar3 = 0x8f;
          }
          else {
            pcVar4 = "r == 0";
            uVar3 = 0x8b;
          }
          goto LAB_0015c0a8;
        }
        for (lVar6 = 8; lVar6 != 0x10008; lVar6 = lVar6 + 0x10) {
          uStack_10040 = 0x15c046;
          auVar7 = uv_buf_init(send_buffer + bytes_sent,0x2728);
          *(long *)((long)send_bufs + lVar6 + -8) = auVar7._0_8_;
          *(long *)((long)&send_bufs[0].base + lVar6) = auVar7._8_8_;
          bytes_sent = bytes_sent + 0x2728;
        }
        uStack_10040 = 0x15c07d;
        iVar2 = uv_write(write_reqs + lVar5,puVar1,send_bufs,0x1000,write_cb);
        lVar5 = lVar5 + 1;
      } while (iVar2 == 0);
      pcVar4 = "r == 0";
      uVar3 = 0x86;
    }
    else {
      pcVar4 = "status == 0";
      uStack_10040 = 0x77;
      uVar3 = uStack_10040;
    }
  }
  else {
    pcVar4 = "req == &connect_req";
    uStack_10040 = 0x76;
    uVar3 = uStack_10040;
  }
LAB_0015c0a8:
  uStack_10040 = 0x15c0af;
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-writealot.c"
          ,uVar3,pcVar4);
  uStack_10040 = 0x15c0b4;
  abort();
}

Assistant:

static void connect_cb(uv_connect_t* req, int status) {
  uv_buf_t buf;

  puts("Connected. Write some data to echo server...");

  ASSERT(status == 0);
  ASSERT(nested == 0 && "connect_cb must be called from a fresh stack");

  nested++;

  buf.base = (char*) &MESSAGE;
  buf.len = sizeof MESSAGE;

  if (uv_write(&write_req, (uv_stream_t*)req->handle, &buf, 1, write_cb)) {
    FATAL("uv_write failed");
  }

  nested--;

  connect_cb_called++;
}